

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.hpp
# Opt level: O2

void __thiscall
CorUnix::CSharedMemoryObjectManager::CSharedMemoryObjectManager(CSharedMemoryObjectManager *this)

{
  *(undefined ***)this = &PTR_AllocateObject_001877e0;
  this->m_fListLockInitialized = false;
  (this->m_HandleManager)._vptr_CSimpleHandleManager =
       (_func_int **)&PTR__CSimpleHandleManager_00187588;
  (this->m_HandleManager).m_hiFreeListStart = 0xffffffffffffffff;
  (this->m_HandleManager).m_hiFreeListEnd = 0xffffffffffffffff;
  (this->m_HandleManager).m_dwTableSize = 0;
  (this->m_HandleManager).m_dwTableGrowthRate = 0x400;
  (this->m_HandleManager).m_rghteHandleTable = (HANDLE_TABLE_ENTRY *)0x0;
  (this->m_HandleManager).m_fLockInitialized = false;
  return;
}

Assistant:

CSharedMemoryObjectManager()
            :
            m_fListLockInitialized(FALSE)
        {
        }